

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O0

int CfdGetBlockHeaderData
              (void *handle,void *block_handle,uint32_t *version,char **prev_block_hash,
              char **merkle_root_hash,uint32_t *time,uint32_t *bits,uint32_t *nonce)

{
  undefined8 uVar1;
  CfdException *this;
  undefined8 *in_RCX;
  undefined4 *in_RDX;
  long in_RSI;
  undefined8 *in_R8;
  undefined4 *in_R9;
  undefined4 *in_stack_00000008;
  undefined4 *in_stack_00000010;
  CfdException *except;
  exception *std_except;
  BlockHeader header;
  CfdCapiBlockData *block_data;
  char *work_merkle_root_hash;
  char *work_prev_block_hash;
  int result;
  BlockHeader *in_stack_fffffffffffffdc8;
  BlockHeader *in_stack_fffffffffffffdd0;
  BlockHeader *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffe30;
  string local_1b0;
  undefined1 local_18a;
  allocator local_189;
  string local_188 [96];
  string *in_stack_fffffffffffffed8;
  void *in_stack_fffffffffffffee0;
  allocator local_109;
  string local_108 [32];
  undefined4 local_e8;
  BlockHash local_e0;
  BlockHash local_c0;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  long local_90;
  allocator local_81;
  string local_80 [48];
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  undefined4 *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined4 *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"BlockOpe",&local_81);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_90 = local_18;
  cfd::core::BlockHeader::BlockHeader(in_stack_fffffffffffffde0);
  if (*(long *)(local_90 + 0x18) == 0) {
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"Invalid handle state. block is null",&local_109);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdf0,error_code,(string *)in_stack_fffffffffffffde0);
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(int *)(local_90 + 0x10) < 3) {
    cfd::core::Block::GetBlockHeader((BlockHeader *)(local_188 + 0x20),*(Block **)(local_90 + 0x18))
    ;
    cfd::core::BlockHeader::operator=(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    cfd::core::BlockHeader::~BlockHeader(in_stack_fffffffffffffdd0);
    if (local_28 != (undefined8 *)0x0) {
      cfd::core::BlockHash::GetHex_abi_cxx11_(&local_1b0,&local_e0);
      local_48 = cfd::capi::CreateString(in_stack_fffffffffffffe30);
      std::__cxx11::string::~string((string *)&local_1b0);
    }
    if (local_30 != (undefined8 *)0x0) {
      cfd::core::BlockHash::GetHex_abi_cxx11_((string *)&stack0xfffffffffffffe30,&local_c0);
      local_50 = cfd::capi::CreateString(in_stack_fffffffffffffe30);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
    }
    if (local_20 != (undefined4 *)0x0) {
      *local_20 = local_e8;
    }
    if (local_28 != (undefined8 *)0x0) {
      *local_28 = local_48;
    }
    if (local_30 != (undefined8 *)0x0) {
      *local_30 = local_50;
    }
    if (local_38 != (undefined4 *)0x0) {
      *local_38 = local_a0;
    }
    if (in_stack_00000008 != (undefined4 *)0x0) {
      *in_stack_00000008 = local_9c;
    }
    if (in_stack_00000010 != (undefined4 *)0x0) {
      *in_stack_00000010 = local_98;
    }
    local_4 = 0;
    cfd::core::BlockHeader::~BlockHeader(in_stack_fffffffffffffdd0);
    return local_4;
  }
  local_18a = 1;
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"Elements is not supported.",&local_189);
  cfd::core::CfdException::CfdException(this,error_code,(string *)in_stack_fffffffffffffde0);
  local_18a = 0;
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetBlockHeaderData(
    void* handle, void* block_handle, uint32_t* version,
    char** prev_block_hash, char** merkle_root_hash, uint32_t* time,
    uint32_t* bits, uint32_t* nonce) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_prev_block_hash = nullptr;
  char* work_merkle_root_hash = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(block_handle, kPrefixBlock);
    CfdCapiBlockData* block_data =
        static_cast<CfdCapiBlockData*>(block_handle);

    BlockHeader header;
    if (block_data->block == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. block is null");
    } else if (block_data->net_type <= NetType::kRegtest) {
      header = block_data->block->GetBlockHeader();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (prev_block_hash != nullptr) {
      work_prev_block_hash = CreateString(header.prev_block_hash.GetHex());
    }
    if (merkle_root_hash != nullptr) {
      work_merkle_root_hash = CreateString(header.merkle_root_hash.GetHex());
    }

    if (version != nullptr) *version = header.version;
    if (prev_block_hash != nullptr) {
      *prev_block_hash = work_prev_block_hash;
    }
    if (merkle_root_hash != nullptr) {
      *merkle_root_hash = work_merkle_root_hash;
    }
    if (time != nullptr) *time = header.time;
    if (bits != nullptr) *bits = header.bits;
    if (nonce != nullptr) *nonce = header.nonce;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_prev_block_hash, &work_merkle_root_hash);
  return result;
}